

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
List_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>
::reorder<std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (List_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>
           *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *valueMap,Index columnIndex)

{
  uint uVar1;
  key_type *__k;
  pointer puVar2;
  Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>
  *__v;
  list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>*>>
  *plVar3;
  long lVar4;
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>>,Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>>>
  *this_00;
  long lVar5;
  list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>*>>
  *plVar6;
  long lVar7;
  list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>*>>
  *plVar8;
  bool bVar9;
  pair<std::_Rb_tree_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::_Rb_tree_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>
  pVar10;
  ID_index local_3c;
  list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>*>>
  *local_38;
  
  plVar6 = (list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>*>>
            *)(this + 0x10);
  plVar8 = *(list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>*>>
             **)(this + 0x10);
  plVar3 = plVar6;
  if (plVar8 != plVar6) {
    do {
      local_38 = plVar3;
      __k = *(key_type **)(plVar8 + 0x10);
      lVar7 = *(long *)(this + 8);
      if (lVar7 != 0) {
        lVar4 = *(long *)(lVar7 + 0x10);
        lVar7 = lVar7 + 8;
        if (lVar4 != 0) {
          uVar1 = __k->rowIndex_;
          lVar5 = lVar7;
          do {
            bVar9 = *(uint *)(lVar4 + 0x20) < uVar1;
            if (!bVar9) {
              lVar5 = lVar4;
            }
            lVar4 = *(long *)(lVar4 + 0x10 + (ulong)bVar9 * 8);
          } while (lVar4 != 0);
          if ((lVar5 != lVar7) && (*(uint *)(lVar5 + 0x20) <= uVar1)) {
            lVar7 = lVar5;
          }
        }
        pVar10 = std::
                 _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>
                 ::equal_range((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>
                                *)(lVar7 + 0x28),__k);
        std::
        _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>
        ::_M_erase_aux((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>
                        *)(lVar7 + 0x28),(_Base_ptr)pVar10.first._M_node,
                       (_Base_ptr)pVar10.second._M_node);
        plVar6 = local_38;
      }
      if (columnIndex != 0xffffffff) {
        (__k->super_Entry_column_index_option).columnIndex_ = columnIndex;
      }
      puVar2 = (valueMap->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(valueMap->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 2) <=
          (ulong)__k->rowIndex_) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      __k->rowIndex_ = puVar2[__k->rowIndex_];
      plVar8 = *(list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>*>>
                 **)plVar8;
      plVar3 = local_38;
    } while (plVar8 != plVar6);
    plVar8 = *(list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>*>>
               **)plVar6;
  }
  if (plVar8 != plVar6) {
    do {
      __v = *(Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>
              **)(plVar8 + 0x10);
      local_3c = __v->rowIndex_;
      if (*(map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>_>_>_>
            **)(this + 8) !=
          (map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>_>_>_>
           *)0x0) {
        this_00 = (_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>>,Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>>>
                   *)std::
                     map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>_>_>_>
                     ::operator[](*(map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>_>_>_>
                                    **)(this + 8),&local_3c);
        std::
        _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>>,Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>>>
        ::
        _M_insert_unique<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>const&>
                  (this_00,__v);
      }
      plVar8 = *(list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>*>>
                 **)plVar8;
    } while (plVar8 != plVar6);
  }
  std::__cxx11::
  list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>*>>
  ::
  sort<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>::reorder<std::vector<unsigned_int,std::allocator<unsigned_int>>>(std::vector<unsigned_int,std::allocator<unsigned_int>>const&,unsigned_int)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>const*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>const*)_1_>
            (plVar6);
  return;
}

Assistant:

inline void List_column<Master_matrix>::reorder(const Row_index_map& valueMap, [[maybe_unused]] Index columnIndex)
{
  static_assert(!Master_matrix::isNonBasic || Master_matrix::Option_list::is_of_boundary_type,
                "Method not available for chain columns.");

  for (auto it = column_.begin(); it != column_.end(); ++it) {
    Entry* entry = *it;
    if constexpr (Master_matrix::Option_list::has_row_access) {
      RA_opt::unlink(entry);
      if (columnIndex != Master_matrix::template get_null_value<Index>()) entry->set_column_index(columnIndex);
    }
    entry->set_row_index(valueMap.at(entry->get_row_index()));
    if constexpr (Master_matrix::Option_list::has_intrusive_rows && Master_matrix::Option_list::has_row_access)
      RA_opt::insert_entry(entry->get_row_index(), entry);
  }

  // all entries have to be deleted first, to avoid problem with insertion when row is a set
  if constexpr (!Master_matrix::Option_list::has_intrusive_rows && Master_matrix::Option_list::has_row_access) {
    for (auto it = column_.begin(); it != column_.end(); ++it) {
      Entry* entry = *it;
      RA_opt::insert_entry(entry->get_row_index(), entry);
    }
  }

  column_.sort([](const Entry* c1, const Entry* c2) { return *c1 < *c2; });
}